

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_dist_wtd_convolve_2d_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  ushort uVar1;
  ushort uVar2;
  uint8_t uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int16_t *piVar7;
  byte bVar8;
  byte bVar9;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  InterpFilterParams *in_stack_00000008;
  int32_t tmp;
  CONV_BUF_TYPE res;
  InterpFilterParams *in_stack_00000010;
  int k_1;
  int32_t sum_1;
  int x_1;
  int y_1;
  int offset_bits;
  int16_t *y_filter;
  int16_t *src_vert;
  int k;
  int32_t sum;
  int x;
  int y;
  int16_t *x_filter;
  uint8_t *src_horiz;
  int round_bits;
  int bd;
  int fo_horiz;
  int fo_vert;
  int im_stride;
  int im_h;
  int16_t im_block [17792];
  int dst16_stride;
  CONV_BUF_TYPE *dst16;
  int local_8b9c;
  int local_8b94;
  int local_8b90;
  int local_8b8c;
  int local_8b88;
  int local_8b70;
  int local_8b6c;
  int local_8b68;
  int local_8b64;
  short local_8b38 [17794];
  int local_34;
  long local_30;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  int local_c;
  
  local_30 = *(long *)(y_filter + 4);
  local_34 = *(int *)(y_filter + 8);
  uVar1 = in_stack_00000010->taps;
  iVar4 = in_stack_00000010->taps / 2 - 1;
  uVar2 = in_stack_00000008->taps;
  bVar8 = ('\x0e' - (char)*(undefined4 *)(y_filter + 10)) - (char)*(undefined4 *)(y_filter + 0xc);
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  piVar7 = av1_get_interp_filter_subpel_kernel(in_stack_00000008,sum_1 & 0xf);
  for (local_8b64 = 0; local_8b64 < (int)(in_R9D + (uint)uVar1 + -1); local_8b64 = local_8b64 + 1) {
    for (local_8b68 = 0; local_8b68 < local_20; local_8b68 = local_8b68 + 1) {
      local_8b6c = 0x4000;
      for (local_8b70 = 0; local_8b70 < (int)(uint)in_stack_00000008->taps;
          local_8b70 = local_8b70 + 1) {
        local_8b6c = (int)piVar7[local_8b70] *
                     (uint)*(byte *)((in_RDI - iVar4 * in_ESI) +
                                    (long)(int)(((local_8b64 * local_c + local_8b68) -
                                                (uVar2 / 2 - 1)) + local_8b70)) + local_8b6c;
      }
      local_8b38[local_8b64 * in_R8D + local_8b68] =
           (short)(local_8b6c + ((1 << ((byte)*(undefined4 *)(y_filter + 10) & 0x1f)) >> 1) >>
                  ((byte)*(undefined4 *)(y_filter + 10) & 0x1f));
    }
  }
  piVar7 = av1_get_interp_filter_subpel_kernel(in_stack_00000010,y_1 & 0xf);
  bVar9 = 0x16 - (char)*(undefined4 *)(y_filter + 10);
  for (local_8b88 = 0; local_8b88 < local_24; local_8b88 = local_8b88 + 1) {
    for (local_8b8c = 0; local_8b8c < local_20; local_8b8c = local_8b8c + 1) {
      local_8b90 = 1 << (bVar9 & 0x1f);
      for (local_8b94 = 0; local_8b94 < (int)(uint)in_stack_00000010->taps;
          local_8b94 = local_8b94 + 1) {
        local_8b90 = (int)piVar7[local_8b94] *
                     (int)local_8b38
                          [(long)(iVar4 * in_R8D) +
                           (long)(((local_8b88 - iVar4) + local_8b94) * in_R8D + local_8b8c)] +
                     local_8b90;
      }
      uVar5 = local_8b90 + ((1 << ((byte)*(undefined4 *)(y_filter + 0xc) & 0x1f)) >> 1) >>
              ((byte)*(undefined4 *)(y_filter + 0xc) & 0x1f);
      if (*(int *)y_filter == 0) {
        *(short *)(local_30 + (long)(local_8b88 * local_34 + local_8b8c) * 2) = (short)uVar5;
      }
      else {
        uVar6 = (uint)*(ushort *)(local_30 + (long)(local_8b88 * local_34 + local_8b8c) * 2);
        if (*(int *)(y_filter + 0x12) == 0) {
          local_8b9c = (int)((uVar5 & 0xffff) + uVar6) >> 1;
        }
        else {
          local_8b9c = (int)(uVar6 * *(int *)(y_filter + 0x14) +
                            (uVar5 & 0xffff) * *(int *)(y_filter + 0x16)) >> 4;
        }
        uVar3 = clip_pixel((local_8b9c -
                           ((1 << (bVar9 - (char)*(undefined4 *)(y_filter + 0xc) & 0x1f)) +
                           (1 << ((bVar9 - (char)*(undefined4 *)(y_filter + 0xc)) - 1 & 0x1f)))) +
                           ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f));
        *(uint8_t *)(local_18 + (local_8b88 * local_1c + local_8b8c)) = uVar3;
      }
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_c(const uint8_t *src, int src_stride,
                                uint8_t *dst, int dst_stride, int w, int h,
                                const InterpFilterParams *filter_params_x,
                                const InterpFilterParams *filter_params_y,
                                const int subpel_x_qn, const int subpel_y_qn,
                                ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bd = 8;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  // horizontal filter
  const uint8_t *src_horiz = src - fo_vert * src_stride;
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_horiz[y * src_stride + x - fo_horiz + k];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_vert[(y - fo_vert + k) * im_stride + x];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= (1 << (offset_bits - conv_params->round_1)) +
               (1 << (offset_bits - conv_params->round_1 - 1));
        dst[y * dst_stride + x] =
            clip_pixel(ROUND_POWER_OF_TWO(tmp, round_bits));
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}